

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::push
          (iterator *this,node_ptr node,byte key_byte,uint8_t child_index,key_prefix_snapshot prefix
          )

{
  key_view v;
  iter_result<unodb::detail::node_header> local_38;
  key_prefix_snapshot local_20;
  key_prefix_snapshot prefix_local;
  
  local_20 = prefix;
  if ((node.tagged_ptr & 7) != 0) {
    local_38.node.tagged_ptr = node.tagged_ptr;
    local_38.key_byte = key_byte;
    local_38.child_index = child_index;
    local_38.prefix = prefix;
    std::
    deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
    ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
              ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
                *)&this->stack_,&local_38);
    v._M_extent._M_extent_value._0_1_ = local_20.f.key_prefix_length;
    v._M_ptr = (pointer)&local_20;
    v._M_extent._M_extent_value._1_7_ = 0;
    detail::key_buffer::push(&this->keybuf_,v);
    detail::key_buffer::push(&this->keybuf_,key_byte);
    return;
  }
  __assert_fail("node.type() != node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x160,
                "void unodb::db<unsigned long, std::span<const std::byte>>::iterator::push(detail::node_ptr, std::byte, std::uint8_t, detail::key_prefix_snapshot) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void push(detail::node_ptr node, std::byte key_byte,
              std::uint8_t child_index, detail::key_prefix_snapshot prefix) {
      // For variable length keys we need to know the number of bytes
      // associated with the node's key_prefix.  In addition there is
      // one byte for the descent to the child node along the
      // child_index.  That information needs to be stored on the
      // stack so we can pop off the right number of bytes even for
      // OLC where the node might be concurrently modified.
      UNODB_DETAIL_ASSERT(node.type() != node_type::LEAF);
      stack_.push({node, key_byte, child_index, prefix});
      keybuf_.push(prefix.get_key_view());
      keybuf_.push(key_byte);
    }